

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sDrawTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Stress::anon_unknown_0::DrawInvalidRangeCase::DrawInvalidRangeCase
          (DrawInvalidRangeCase *this,Context *ctx,char *name,char *desc,deUint32 min,deUint32 max,
          bool useLimitMin,bool useLimitMax)

{
  gles3::TestCase::TestCase(&this->super_TestCase,ctx,name,"Range over buffer bounds");
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__DrawInvalidRangeCase_01e44440;
  this->m_min = (int)desc;
  this->m_max = min;
  this->m_bufferedElements = 0x80;
  this->m_numIndices = 0x40;
  this->m_useLimitMin = SUB41(max,0);
  this->m_useLimitMax = useLimitMin;
  this->m_buffer = 0;
  this->m_indexBuffer = 0;
  this->m_program = (ShaderProgram *)0x0;
  return;
}

Assistant:

DrawInvalidRangeCase::DrawInvalidRangeCase (Context& ctx, const char* name, const char* desc, deUint32 min, deUint32 max, bool useLimitMin, bool useLimitMax)
	: TestCase				(ctx, name, desc)
	, m_min					(min)
	, m_max					(max)
	, m_bufferedElements	(128)
	, m_numIndices			(64)
	, m_useLimitMin			(useLimitMin)
	, m_useLimitMax			(useLimitMax)
	, m_buffer				(0)
	, m_indexBuffer			(0)
	, m_program				(DE_NULL)
{
}